

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zDec.c
# Opt level: O0

SRes SzDecodeCopy(UInt64 inSize,ILookInStream *inStream,Byte *outBuffer)

{
  int iVar1;
  void *in_RDX;
  undefined8 *in_RSI;
  ulong in_RDI;
  int __result___1;
  int __result__;
  size_t curSize;
  void *inBuf;
  size_t local_30;
  void *local_28;
  void *local_20;
  undefined8 *local_18;
  ulong local_10;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  do {
    if (local_10 == 0) {
      return 0;
    }
    local_30 = 0x40000;
    if (local_10 < 0x40000) {
      local_30 = local_10;
    }
    iVar1 = (*(code *)*local_18)(local_18,&local_28,&local_30);
    if (iVar1 != 0) {
      return iVar1;
    }
    if (local_30 == 0) {
      return 6;
    }
    memcpy(local_20,local_28,local_30);
    local_20 = (void *)(local_30 + (long)local_20);
    local_10 = local_10 - local_30;
    iVar1 = (*(code *)local_18[1])(local_18,local_30);
  } while (iVar1 == 0);
  return iVar1;
}

Assistant:

static SRes SzDecodeCopy(UInt64 inSize, ILookInStream *inStream, Byte *outBuffer)
{
  while (inSize > 0)
  {
    const void *inBuf;
    size_t curSize = (1 << 18);
    if (curSize > inSize)
      curSize = (size_t)inSize;
    RINOK(inStream->Look(inStream, &inBuf, &curSize));
    if (curSize == 0)
      return SZ_ERROR_INPUT_EOF;
    memcpy(outBuffer, inBuf, curSize);
    outBuffer += curSize;
    inSize -= curSize;
    RINOK(inStream->Skip((void *)inStream, curSize));
  }
  return SZ_OK;
}